

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cpp
# Opt level: O3

bool JSON::ExtractString(wchar_t **data,wstring *str)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  int iVar3;
  long lVar4;
  wchar_t *pwVar5;
  
  std::__cxx11::wstring::_M_replace((ulong)str,0,(wchar_t *)str->_M_string_length,0x17e910);
  pwVar5 = *data;
  do {
    wVar2 = *pwVar5;
    if (wVar2 == L'\\') {
      *data = pwVar5 + 1;
      wVar2 = pwVar5[1];
      if (wVar2 < L'b') {
        if (((wVar2 != L'\"') && (wVar2 != L'/')) && (wVar2 != L'\\')) {
          return false;
        }
      }
      else {
        switch(wVar2) {
        case L'n':
          break;
        case L'o':
        case L'p':
        case L'q':
        case L's':
          goto switchD_00170f89_caseD_6f;
        case L'r':
          break;
        case L't':
          break;
        case L'u':
          lVar4 = 1;
          while (lVar4 != 6) {
            pwVar1 = pwVar5 + lVar4;
            lVar4 = lVar4 + 1;
            if (*pwVar1 == L'\0') {
              return false;
            }
          }
          lVar4 = 0;
          do {
            iVar3 = *(int *)((long)pwVar5 + lVar4 + 8);
            if (((9 < iVar3 - 0x30U) && (5 < iVar3 - 0x41U)) && (5 < iVar3 - 0x61U)) {
              *data = (wchar_t *)((long)pwVar5 + lVar4 + 8);
              return false;
            }
            lVar4 = lVar4 + 4;
          } while ((int)lVar4 != 0x10);
          *data = pwVar5 + 5;
          break;
        default:
          if ((wVar2 != L'b') && (wVar2 != L'f')) {
            return false;
          }
        }
      }
    }
    else {
      if (wVar2 == L'\0') {
switchD_00170f89_caseD_6f:
        return false;
      }
      if (wVar2 == L'\"') {
        *data = pwVar5 + 1;
        std::__cxx11::wstring::reserve();
        return true;
      }
      if (wVar2 < L' ' && wVar2 != L'\t') {
        return false;
      }
    }
    std::__cxx11::wstring::push_back((wchar_t)str);
    pwVar5 = *data + 1;
    *data = pwVar5;
  } while( true );
}

Assistant:

bool JSON::ExtractString(const wchar_t **data, std::wstring &str)
{
	str = L"";
	
	while (**data != 0)
	{
		// Save the char so we can change it if need be
		wchar_t next_char = **data;
		
		// Escaping something?
		if (next_char == L'\\')
		{
			// Move over the escape char
			(*data)++;
			
			// Deal with the escaped char
			switch (**data)
			{
				case L'"': next_char = L'"'; break;
				case L'\\': next_char = L'\\'; break;
				case L'/': next_char = L'/'; break;
				case L'b': next_char = L'\b'; break;
				case L'f': next_char = L'\f'; break;
				case L'n': next_char = L'\n'; break;
				case L'r': next_char = L'\r'; break;
				case L't': next_char = L'\t'; break;
				case L'u':
				{
					// We need 5 chars (4 hex + the 'u') or its not valid
					if (!simplejson_wcsnlen(*data, 5))
						return false;
					
					// Deal with the chars
					next_char = 0;
					for (int i = 0; i < 4; i++)
					{
						// Do it first to move off the 'u' and leave us on the
						// final hex digit as we move on by one later on
						(*data)++;
						
						next_char <<= 4;
						
						// Parse the hex digit
						if (**data >= '0' && **data <= '9')
							next_char |= (**data - '0');
						else if (**data >= 'A' && **data <= 'F')
							next_char |= (10 + (**data - 'A'));
						else if (**data >= 'a' && **data <= 'f')
							next_char |= (10 + (**data - 'a'));
						else
						{
							// Invalid hex digit = invalid JSON
							return false;
						}
					}
					break;
				}
				
				// By the spec, only the above cases are allowed
				default:
					return false;
			}
		}
		
		// End of the string?
		else if (next_char == L'"')
		{
			(*data)++;
			str.reserve(); // Remove unused capacity
			return true;
		}
		
		// Disallowed char?
		else if (next_char < L' ' && next_char != L'\t')
		{
			// SPEC Violation: Allow tabs due to real world cases
			return false;
		}
		
		// Add the next char
		str += next_char;
		
		// Move on
		(*data)++;
	}
	
	// If we're here, the string ended incorrectly
	return false;
}